

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O3

string * __thiscall
flatbuffers::(anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Type *type,bool element_type,bool enum_inner)

{
  Type TVar1;
  ushort uVar2;
  long lVar3;
  Enum *pEVar4;
  long *plVar5;
  string *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  Object *pOVar7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  string *extraout_RAX_02;
  undefined7 in_register_00000009;
  size_type *psVar9;
  BaseType base_type;
  char *pcVar10;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string importns;
  string type_name;
  string local_88;
  string local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  lVar3 = -(long)*(int *)type;
  if ((int)CONCAT71(in_register_00000009,element_type) == 0) {
    if (4 < *(ushort *)(type + -(long)*(int *)type)) {
      uVar2 = *(ushort *)(type + lVar3 + 4);
      goto LAB_0032e84c;
    }
  }
  else if (6 < *(ushort *)(type + -(long)*(int *)type)) {
    uVar2 = *(ushort *)(type + lVar3 + 6);
LAB_0032e84c:
    if (uVar2 != 0) {
      TVar1.super_Table = type[uVar2].super_Table;
      if ((int)(char)TVar1.super_Table - 1U < 0xc) {
        pEVar4 = BaseBfbsGenerator::GetEnum((BaseBfbsGenerator *)this,type,element_type);
        if (pEVar4 != (Enum *)0x0) {
          local_68._M_string_length = 0;
          local_68.field_2._M_allocated_capacity =
               local_68.field_2._M_allocated_capacity & 0xffffffffffffff00;
          uVar8 = (ulong)*(ushort *)(pEVar4 + (4 - (long)*(int *)pEVar4));
          paVar6 = &local_88.field_2;
          local_88._M_dataplus._M_p = (pointer)paVar6;
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,pEVar4 + *(uint *)(pEVar4 + uVar8) + uVar8 + 4,
                     pEVar4 + (ulong)*(uint *)(pEVar4 + *(uint *)(pEVar4 + uVar8) + uVar8) +
                              *(uint *)(pEVar4 + uVar8) + uVar8 + 4);
          anon_unknown_0::NimBfbsGenerator::Denamespace
                    ((string *)&local_48,(NimBfbsGenerator *)this,&local_88,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar6) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          local_88._M_dataplus._M_p = (pointer)paVar6;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_88,local_68._M_dataplus._M_p,
                     local_68._M_dataplus._M_p + local_68._M_string_length);
          std::__cxx11::string::append((char *)&local_88);
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_88,local_48._M_allocated_capacity);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          psVar9 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar9) {
            lVar3 = plVar5[3];
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
            *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
          }
          __return_storage_ptr__->_M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar6) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          paVar6 = &local_38;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_allocated_capacity != paVar6) {
            operator_delete((void *)local_48._M_allocated_capacity,
                            local_38._M_allocated_capacity + 1);
            paVar6 = extraout_RAX_00;
          }
          local_38._M_allocated_capacity = local_68.field_2._M_allocated_capacity;
          local_48._M_allocated_capacity = (size_type)local_68._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p == &local_68.field_2) {
            return (string *)paVar6;
          }
          goto LAB_0032ed13;
        }
        GenerateType_abi_cxx11_
                  ((string *)&local_48,(void *)(ulong)(uint)(int)(char)TVar1.super_Table,base_type);
        local_68._M_string_length = 0;
        local_68.field_2._M_allocated_capacity =
             local_68.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        anon_unknown_0::NimBfbsGenerator::Denamespace
                  (__return_storage_ptr__,(NimBfbsGenerator *)this,(string *)&local_48,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) goto LAB_0032ea03;
LAB_0032ea10:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_allocated_capacity == &local_38) {
          return (string *)&local_38;
        }
LAB_0032ed13:
        operator_delete((void *)local_48._M_allocated_capacity,local_38._M_allocated_capacity + 1);
        return extraout_RAX_02;
      }
      switch(TVar1.super_Table) {
      case (Table)0xd:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar11 = "string";
        pcVar10 = "";
        break;
      case (Table)0xe:
        GenerateType_abi_cxx11_((string *)&local_48,this,type,true,enum_inner);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x381063);
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 == paVar6) {
          local_68.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_68.field_2._8_8_ = plVar5[3];
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        }
        else {
          local_68.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_68._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_68._M_string_length = plVar5[1];
        *plVar5 = (long)paVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar9) {
          lVar3 = plVar5[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        }
        __return_storage_ptr__->_M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_0032ea03:
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0032ea10;
      case (Table)0xf:
        pOVar7 = BaseBfbsGenerator::GetObject((BaseBfbsGenerator *)this,type,element_type);
        local_68._M_string_length = 0;
        local_68.field_2._M_allocated_capacity =
             local_68.field_2._M_allocated_capacity & 0xffffffffffffff00;
        uVar8 = (ulong)*(ushort *)(pOVar7 + (4 - (long)*(int *)pOVar7));
        paVar6 = &local_88.field_2;
        local_88._M_dataplus._M_p = (pointer)paVar6;
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,pOVar7 + (ulong)*(uint *)(pOVar7 + uVar8) + 4 + uVar8,
                   pOVar7 + (ulong)*(uint *)(pOVar7 + (ulong)*(uint *)(pOVar7 + uVar8) + 4 + uVar8 +
                                            -4) + *(uint *)(pOVar7 + uVar8) + uVar8 + 4);
        anon_unknown_0::NimBfbsGenerator::Denamespace
                  ((string *)&local_48,(NimBfbsGenerator *)this,&local_88,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar6) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if (pOVar7 == *(Object **)((long)this + 0xb8)) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_allocated_capacity == &local_38) {
            (__return_storage_ptr__->field_2)._M_allocated_capacity = local_38._M_allocated_capacity
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_38._8_8_;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48._M_allocated_capacity;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = local_38._M_allocated_capacity
            ;
          }
          __return_storage_ptr__->_M_string_length = local_48._8_8_;
        }
        else {
          local_88._M_dataplus._M_p = (pointer)paVar6;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_88,local_68._M_dataplus._M_p,
                     local_68._M_dataplus._M_p + local_68._M_string_length);
          std::__cxx11::string::append((char *)&local_88);
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_88,local_48._M_allocated_capacity);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          psVar9 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar9) {
            lVar3 = plVar5[3];
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
            *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
          }
          __return_storage_ptr__->_M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar6) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          local_48._8_8_ = &local_38;
          if (local_48._M_allocated_capacity != local_48._8_8_) {
            operator_delete((void *)local_48._M_allocated_capacity,
                            local_38._M_allocated_capacity + 1);
            local_48._8_8_ = extraout_RAX_01;
          }
        }
        local_38._M_allocated_capacity = local_68.field_2._M_allocated_capacity;
        local_48._M_allocated_capacity = (size_type)local_68._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p == &local_68.field_2) {
          return (string *)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_48._8_8_;
        }
        goto LAB_0032ed13;
      case (Table)0x10:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar11 = "Vtable";
        pcVar10 = "";
        break;
      default:
        goto switchD_0032e97e_default;
      }
      goto LAB_0032e9ac;
    }
  }
switchD_0032e97e_default:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar11 = "uoffset";
  pcVar10 = "";
LAB_0032e9ac:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar11,pcVar10);
  return extraout_RAX;
}

Assistant:

std::string GenerateType(const r::Type *type, bool element_type = false,
                           bool enum_inner = false) const {
    const r::BaseType base_type =
        element_type ? type->element() : type->base_type();
    if (IsScalar(base_type) && !enum_inner) {
      const r::Enum *type_enum = GetEnum(type, element_type);
      if (type_enum != nullptr) {
        std::string importns;
        std::string type_name = Denamespace(type_enum->name()->str(), importns);
        return importns + "." + type_name;
      }
    }
    if (IsScalar(base_type)) { return Denamespace(GenerateType(base_type)); }
    switch (base_type) {
      case r::String: return "string";
      case r::Vector: {
        return "seq[" + GenerateType(type, true) + "]";
      }
      case r::Union: return "Vtable";
      case r::Obj: {
        const r::Object *type_obj = GetObject(type, element_type);
        std::string importns;
        std::string type_name = Denamespace(type_obj->name()->str(), importns);
        if (type_obj == current_obj_) {
          return type_name;
        } else {
          return importns + "." + type_name;
        }
      }
      default: return "uoffset";
    }
  }